

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O2

void __thiscall leveldb::_Test_CustomComparator::_Run(_Test_CustomComparator *this)

{
  string *psVar1;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  allocator local_301;
  DBTest *local_300;
  allocator local_2f1;
  undefined1 local_2f0 [8];
  string local_2e8;
  NumberComparator cmp;
  undefined1 local_2b8 [32];
  char buf [100];
  char *local_230;
  FilterPolicy *local_228;
  Options new_options;
  
  cmp.super_Comparator._vptr_Comparator = (Comparator)&PTR__Comparator_00152ba8;
  DBTest::CurrentOptions(&new_options,&this->super_DBTest);
  new_options.create_if_missing = true;
  new_options.comparator = &cmp.super_Comparator;
  new_options.filter_policy = (FilterPolicy *)0x0;
  new_options.write_buffer_size = 1000;
  DBTest::DestroyAndReopen(&this->super_DBTest,&new_options);
  test::Tester::Tester
            ((Tester *)&local_230,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x619);
  std::__cxx11::string::string((string *)buf,"[10]",(allocator *)local_2f0);
  std::__cxx11::string::string((string *)(local_2f0 + 8),"ten",&local_301);
  DBTest::Put((DBTest *)local_2b8,(string *)this,(string *)buf);
  test::Tester::IsOk((Tester *)&local_230,(Status *)local_2b8);
  Status::~Status((Status *)local_2b8);
  std::__cxx11::string::~string((string *)(local_2f0 + 8));
  std::__cxx11::string::~string((string *)buf);
  test::Tester::~Tester((Tester *)&local_230);
  test::Tester::Tester
            ((Tester *)&local_230,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x61a);
  std::__cxx11::string::string((string *)buf,"[0x14]",(allocator *)local_2f0);
  std::__cxx11::string::string((string *)(local_2f0 + 8),"twenty",&local_301);
  DBTest::Put((DBTest *)local_2b8,(string *)this,(string *)buf);
  local_300 = &this->super_DBTest;
  test::Tester::IsOk((Tester *)&local_230,(Status *)local_2b8);
  Status::~Status((Status *)local_2b8);
  psVar1 = (string *)(local_2f0 + 8);
  std::__cxx11::string::~string((string *)psVar1);
  std::__cxx11::string::~string((string *)buf);
  test::Tester::~Tester((Tester *)&local_230);
  iVar2 = 2;
  while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
    test::Tester::Tester
              ((Tester *)&local_230,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x61c);
    std::__cxx11::string::string((string *)psVar1,"[10]",(allocator *)local_2b8);
    DBTest::Get((string *)buf,local_300,psVar1,(Snapshot *)0x0);
    test::Tester::IsEq<char[4],std::__cxx11::string>
              ((Tester *)&local_230,(char (*) [4])"ten",(string *)buf);
    std::__cxx11::string::~string((string *)buf);
    std::__cxx11::string::~string((string *)psVar1);
    test::Tester::~Tester((Tester *)&local_230);
    test::Tester::Tester
              ((Tester *)&local_230,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x61d);
    std::__cxx11::string::string((string *)psVar1,"[0xa]",(allocator *)local_2b8);
    DBTest::Get((string *)buf,local_300,psVar1,(Snapshot *)0x0);
    test::Tester::IsEq<char[4],std::__cxx11::string>
              ((Tester *)&local_230,(char (*) [4])"ten",(string *)buf);
    std::__cxx11::string::~string((string *)buf);
    std::__cxx11::string::~string((string *)psVar1);
    test::Tester::~Tester((Tester *)&local_230);
    test::Tester::Tester
              ((Tester *)&local_230,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x61e);
    std::__cxx11::string::string((string *)psVar1,"[20]",(allocator *)local_2b8);
    DBTest::Get((string *)buf,local_300,psVar1,(Snapshot *)0x0);
    test::Tester::IsEq<char[7],std::__cxx11::string>
              ((Tester *)&local_230,(char (*) [7])"twenty",(string *)buf);
    std::__cxx11::string::~string((string *)buf);
    std::__cxx11::string::~string((string *)psVar1);
    test::Tester::~Tester((Tester *)&local_230);
    test::Tester::Tester
              ((Tester *)&local_230,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x61f);
    std::__cxx11::string::string((string *)psVar1,"[0x14]",(allocator *)local_2b8);
    DBTest::Get((string *)buf,local_300,psVar1,(Snapshot *)0x0);
    test::Tester::IsEq<char[7],std::__cxx11::string>
              ((Tester *)&local_230,(char (*) [7])"twenty",(string *)buf);
    std::__cxx11::string::~string((string *)buf);
    std::__cxx11::string::~string((string *)psVar1);
    test::Tester::~Tester((Tester *)&local_230);
    test::Tester::Tester
              ((Tester *)&local_230,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x620);
    std::__cxx11::string::string((string *)psVar1,"[15]",(allocator *)local_2b8);
    DBTest::Get((string *)buf,local_300,psVar1,(Snapshot *)0x0);
    test::Tester::IsEq<char[10],std::__cxx11::string>
              ((Tester *)&local_230,(char (*) [10])"NOT_FOUND",(string *)buf);
    std::__cxx11::string::~string((string *)buf);
    std::__cxx11::string::~string((string *)psVar1);
    test::Tester::~Tester((Tester *)&local_230);
    test::Tester::Tester
              ((Tester *)&local_230,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x621);
    std::__cxx11::string::string((string *)psVar1,"[0xf]",(allocator *)local_2b8);
    DBTest::Get((string *)buf,local_300,psVar1,(Snapshot *)0x0);
    test::Tester::IsEq<char[10],std::__cxx11::string>
              ((Tester *)&local_230,(char (*) [10])"NOT_FOUND",(string *)buf);
    std::__cxx11::string::~string((string *)buf);
    std::__cxx11::string::~string((string *)psVar1);
    test::Tester::~Tester((Tester *)&local_230);
    local_230 = "[0]";
    local_228 = (FilterPolicy *)0x3;
    buf._0_8_ = anon_var_dwarf_18b60;
    buf[8] = '\x06';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    (*local_300->db_->_vptr_DB[0xb])(local_300->db_,(Tester *)&local_230,(string *)buf);
  }
  psVar1 = (string *)(local_2f0 + 8);
  for (iVar2 = 0; iVar2 != 2; iVar2 = iVar2 + 1) {
    for (uVar3 = 0; (int)uVar3 != 10000; uVar3 = (ulong)((int)uVar3 + 10)) {
      snprintf(buf,100,"[%d]",uVar3);
      test::Tester::Tester
                ((Tester *)&local_230,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
                 ,0x629);
      std::__cxx11::string::string((string *)psVar1,buf,&local_301);
      std::__cxx11::string::string((string *)local_2b8,buf,&local_2f1);
      DBTest::Put((DBTest *)local_2f0,&local_300->dbname_,psVar1);
      test::Tester::IsOk((Tester *)&local_230,(Status *)local_2f0);
      Status::~Status((Status *)local_2f0);
      std::__cxx11::string::~string((string *)local_2b8);
      std::__cxx11::string::~string((string *)psVar1);
      test::Tester::~Tester((Tester *)&local_230);
    }
    local_230 = "[0]";
    local_228 = (FilterPolicy *)0x3;
    buf._0_8_ = anon_var_dwarf_18b78;
    buf[8] = '\t';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    (*local_300->db_->_vptr_DB[0xb])(local_300->db_,(Tester *)&local_230,buf);
  }
  Comparator::~Comparator(&cmp.super_Comparator);
  return;
}

Assistant:

TEST(DBTest, CustomComparator) {
  class NumberComparator : public Comparator {
   public:
    const char* Name() const override { return "test.NumberComparator"; }
    int Compare(const Slice& a, const Slice& b) const override {
      return ToNumber(a) - ToNumber(b);
    }
    void FindShortestSeparator(std::string* s, const Slice& l) const override {
      ToNumber(*s);  // Check format
      ToNumber(l);   // Check format
    }
    void FindShortSuccessor(std::string* key) const override {
      ToNumber(*key);  // Check format
    }

   private:
    static int ToNumber(const Slice& x) {
      // Check that there are no extra characters.
      ASSERT_TRUE(x.size() >= 2 && x[0] == '[' && x[x.size() - 1] == ']')
          << EscapeString(x);
      int val;
      char ignored;
      ASSERT_TRUE(sscanf(x.ToString().c_str(), "[%i]%c", &val, &ignored) == 1)
          << EscapeString(x);
      return val;
    }
  };
  NumberComparator cmp;
  Options new_options = CurrentOptions();
  new_options.create_if_missing = true;
  new_options.comparator = &cmp;
  new_options.filter_policy = nullptr;   // Cannot use bloom filters
  new_options.write_buffer_size = 1000;  // Compact more often
  DestroyAndReopen(&new_options);
  ASSERT_OK(Put("[10]", "ten"));
  ASSERT_OK(Put("[0x14]", "twenty"));
  for (int i = 0; i < 2; i++) {
    ASSERT_EQ("ten", Get("[10]"));
    ASSERT_EQ("ten", Get("[0xa]"));
    ASSERT_EQ("twenty", Get("[20]"));
    ASSERT_EQ("twenty", Get("[0x14]"));
    ASSERT_EQ("NOT_FOUND", Get("[15]"));
    ASSERT_EQ("NOT_FOUND", Get("[0xf]"));
    Compact("[0]", "[9999]");
  }

  for (int run = 0; run < 2; run++) {
    for (int i = 0; i < 1000; i++) {
      char buf[100];
      snprintf(buf, sizeof(buf), "[%d]", i * 10);
      ASSERT_OK(Put(buf, buf));
    }
    Compact("[0]", "[1000000]");
  }
}